

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
hta::detail::
make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::operator()
          (make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           *this,stringstream *msg,char *arg,duration<long,_std::ratio<1L,_1000000000L>_> args)

{
  make_exception<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_29;
  char *local_28;
  char *arg_local;
  stringstream *msg_local;
  make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *this_local;
  duration<long,_std::ratio<1L,_1000000000L>_> args_local;
  
  local_28 = arg;
  arg_local = (char *)msg;
  msg_local = (stringstream *)this;
  this_local = (make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)args.__r;
  std::operator<<((ostream *)(msg + 0x10),arg);
  make_exception<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::operator()
            (&local_29,(stringstream *)arg_local,
             (duration<long,_std::ratio<1L,_1000000000L>_>)this_local);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }